

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int write_file_contents(archive_write *a,int64_t offset,int64_t size)

{
  void *pvVar1;
  int iVar2;
  uchar *__buf;
  size_t size_00;
  int *piVar3;
  uchar *wb;
  ssize_t rs;
  size_t rsize;
  int r;
  iso9660_conflict *iso9660;
  int64_t size_local;
  int64_t offset_local;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  lseek(*(int *)((long)pvVar1 + 8),offset,0);
  iso9660 = (iso9660_conflict *)size;
  while( true ) {
    if (iso9660 == (iso9660_conflict *)0x0) {
      return 0;
    }
    __buf = wb_buffptr(a);
    rs = *(ulong *)((long)a->format_data + 0x102e0);
    if (iso9660 < (ulong)rs) {
      rs = (ssize_t)iso9660;
    }
    size_00 = read(*(int *)((long)pvVar1 + 8),__buf,rs);
    if ((long)size_00 < 1) break;
    iso9660 = (iso9660_conflict *)((long)iso9660 - size_00);
    iVar2 = wb_consume(a,size_00);
    if (iVar2 < 0) {
      return iVar2;
    }
  }
  piVar3 = __errno_location();
  archive_set_error(&a->archive,*piVar3,"Can\'t read temporary file(%jd)",size_00);
  return -0x1e;
}

Assistant:

static int
write_file_contents(struct archive_write *a, int64_t offset, int64_t size)
{
	struct iso9660 *iso9660 = a->format_data;
	int r;

	lseek(iso9660->temp_fd, offset, SEEK_SET);

	while (size) {
		size_t rsize;
		ssize_t rs;
		unsigned char *wb;

		wb = wb_buffptr(a);
		rsize = wb_remaining(a);
		if (rsize > (size_t)size)
			rsize = (size_t)size;
		rs = read(iso9660->temp_fd, wb, rsize);
		if (rs <= 0) {
			archive_set_error(&a->archive, errno,
			    "Can't read temporary file(%jd)", (intmax_t)rs);
			return (ARCHIVE_FATAL);
		}
		size -= rs;
		r = wb_consume(a, rs);
		if (r < 0)
			return (r);
	}
	return (ARCHIVE_OK);
}